

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler.hpp
# Opt level: O0

FailCodeType __thiscall mittens::UnHandler<int>::handleException(UnHandler<int> *this)

{
  bool bVar1;
  undefined8 uVar2;
  logic_error *this_00;
  exception_ptr local_20;
  exception_ptr local_18;
  exception_ptr eptr;
  UnHandler<int> *this_local;
  
  eptr._M_exception_object = this;
  std::current_exception();
  bVar1 = std::__exception_ptr::exception_ptr::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_18);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"Mittens handler called outside of a catch clause! This is a BUG.");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__exception_ptr::exception_ptr::exception_ptr(&local_20,&local_18);
  uVar2 = std::rethrow_exception((exception_ptr)&local_20);
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_20);
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_18);
  _Unwind_Resume(uVar2);
}

Assistant:

FailCodeType handleException()
      {
         // Instead of a call to `throw` we will check if the function was called inside a
         // catch clause. If so, `std::rethrow_exception(eptr)` is the same as `throw`.
         // Otherwise, throw an `std::logic_error` since this is obviously a bug.
         if (std::exception_ptr eptr = std::current_exception())
            std::rethrow_exception(eptr);

         throw std::logic_error("Mittens handler called outside of a catch clause! This is a BUG.");
      }